

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testInit(LengthOfVectorAndMatrixTest *this)

{
  undefined1 local_54 [8];
  testCase test_case_3;
  GLuint row_3;
  GLuint col;
  testCase test_case_2;
  GLuint row_2;
  testCase test_case_1;
  GLuint row_1;
  testCase test_case;
  GLuint row;
  LengthOfVectorAndMatrixTest *this_local;
  
  for (test_case.m_n_cols = 2; test_case.m_n_cols < 5; test_case.m_n_cols = test_case.m_n_cols + 1)
  {
    test_case_1.m_n_rows = 3;
    std::
    vector<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase,_std::allocator<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase>_>
    ::push_back(&this->m_test_cases,(value_type *)&test_case_1.m_n_rows);
  }
  for (test_case_1.m_n_cols = 2; test_case_1.m_n_cols < 5;
      test_case_1.m_n_cols = test_case_1.m_n_cols + 1) {
    test_case_2.m_n_rows = 2;
    test_case_1.m_type = test_case_1.m_n_cols;
    std::
    vector<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase,_std::allocator<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase>_>
    ::push_back(&this->m_test_cases,(value_type *)&test_case_2.m_n_rows);
  }
  for (test_case_2.m_n_cols = 2; test_case_2.m_n_cols < 5;
      test_case_2.m_n_cols = test_case_2.m_n_cols + 1) {
    row_3 = 0;
    col = 1;
    test_case_2.m_type = test_case_2.m_n_cols;
    std::
    vector<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase,_std::allocator<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase>_>
    ::push_back(&this->m_test_cases,(value_type *)&row_3);
  }
  for (test_case_3.m_n_rows = 2; test_case_3.m_n_rows < 5;
      test_case_3.m_n_rows = test_case_3.m_n_rows + 1) {
    for (test_case_3.m_n_cols = 2; test_case_3.m_n_cols < 5;
        test_case_3.m_n_cols = test_case_3.m_n_cols + 1) {
      local_54._0_4_ = FLOAT;
      local_54._4_4_ = test_case_3.m_n_rows;
      test_case_3.m_type = test_case_3.m_n_cols;
      std::
      vector<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase,_std::allocator<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase>_>
      ::push_back(&this->m_test_cases,(value_type *)local_54);
    }
  }
  return true;
}

Assistant:

bool LengthOfVectorAndMatrixTest::testInit()
{
	/* Vectors */
	for (GLuint row = 2; row <= 4; ++row)
	{
		testCase test_case = { Utils::UINT, 1 /* n_cols */, row };

		m_test_cases.push_back(test_case);
	}

	for (GLuint row = 2; row <= 4; ++row)
	{
		testCase test_case = { Utils::INT, 1 /* n_cols */, row };

		m_test_cases.push_back(test_case);
	}

	for (GLuint row = 2; row <= 4; ++row)
	{
		testCase test_case = { Utils::FLOAT, 1 /* n_cols */, row };

		m_test_cases.push_back(test_case);
	}

	/* Matrices */
	for (GLuint col = 2; col <= 4; ++col)
	{
		for (GLuint row = 2; row <= 4; ++row)
		{
			testCase test_case = { Utils::FLOAT, col, row };

			m_test_cases.push_back(test_case);
		}
	}

	return true;
}